

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O3

void __thiscall
QGraphicsItemPrivate::combineTransformFromParent
          (QGraphicsItemPrivate *this,QTransform *x,QTransform *viewTransform)

{
  long lVar1;
  QTransform *pQVar2;
  QTransform *pQVar3;
  long in_FS_OFFSET;
  byte bVar4;
  QTransform QStack_68;
  long local_18;
  
  bVar4 = 0;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((viewTransform == (QTransform *)0x0) || ((*(uint *)&this->field_0x161 & 0x20000400) == 0)) {
    QTransform::translate((this->pos).xp,(this->pos).yp);
    if (this->transformData == (TransformData *)0x0) goto LAB_005d63bc;
    TransformData::computedFullTransform(&QStack_68,this->transformData,x);
  }
  else {
    QGraphicsItem::deviceTransform(&QStack_68,this->q_ptr,viewTransform);
  }
  pQVar2 = &QStack_68;
  pQVar3 = x;
  for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
    pQVar3->m_matrix[0][0] = *(qreal *)pQVar2;
    pQVar2 = (QTransform *)((long)pQVar2 + ((ulong)bVar4 * -2 + 1) * 8);
    pQVar3 = (QTransform *)((long)pQVar3 + ((ulong)bVar4 * -2 + 1) * 8);
  }
  *(undefined2 *)&x->field_0x48 = QStack_68._72_2_;
LAB_005d63bc:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsItemPrivate::combineTransformFromParent(QTransform *x, const QTransform *viewTransform) const
{
    // COMBINE
    if (viewTransform && itemIsUntransformable()) {
        *x = q_ptr->deviceTransform(*viewTransform);
    } else {
        x->translate(pos.x(), pos.y());
        if (transformData)
            *x = transformData->computedFullTransform(x);
    }
}